

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

value_type __thiscall
andres::
BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Plus<int,_short,_int>_>
::operator()(BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Plus<int,_short,_int>_>
             *this,size_t c0,size_t c1,size_t c2)

{
  int iVar1;
  reference y;
  size_t c2_local;
  size_t c1_local;
  size_t c0_local;
  BinaryViewExpressionScalarFirst<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_int,_andres::marray_detail::Plus<int,_short,_int>_>
  *this_local;
  
  y = View<short,false,std::allocator<unsigned_long>>::operator()
                ((View<short,false,std::allocator<unsigned_long>> *)this->e_,c0,c1,c2);
  iVar1 = marray_detail::Plus<int,_short,_int>::operator()
                    ((Plus<int,_short,_int> *)&this->field_0xc,&this->scalar_,y);
  return iVar1;
}

Assistant:

const value_type operator()(const std::size_t c0, const std::size_t c1, const std::size_t c2) const 
        { return binaryFunctor_(scalar_, e_(c0, c1, c2)); }